

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  byte *pbVar1;
  ushort uVar2;
  ushort uVar3;
  int iCur;
  Parse *pPVar4;
  bool bVar5;
  bool bVar6;
  uint op;
  int iVar7;
  WhereTerm *pWVar8;
  CollSeq *pCVar9;
  CollSeq *pCVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  long lVar16;
  ulong uVar17;
  Index *pIVar18;
  ExprList_item *pEVar19;
  byte bVar20;
  short sVar21;
  ExprList_item *pEVar22;
  Expr *pEVar23;
  byte bVar24;
  uint uVar25;
  Expr *pA;
  undefined6 in_register_00000082;
  ulong uVar26;
  ulong uVar27;
  WhereLoop *pWVar28;
  bool bVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  char local_10c;
  uint local_c0;
  ulong local_b0;
  Walker local_60;
  
  if (((int)CONCAT62(in_register_00000082,nLoop) == 0) ||
     ((pWInfo->pParse->db->dbOptFlags & 0x40) == 0)) {
    uVar2 = (ushort)pOrderBy->nExpr;
    uVar14 = (ulong)uVar2;
    if (uVar2 < 0x40) {
      op = 0x183 - ((wctrlFlags & 0x803) == 0);
      uVar13 = uVar14;
      if (uVar2 != 0) {
        uVar17 = ~(-1L << ((byte)uVar2 & 0x3f));
        pEVar22 = pOrderBy->a;
        uVar26 = 0;
        local_b0 = 0;
        uVar30 = 0;
        pWVar28 = (WhereLoop *)0x0;
        uVar12 = 0;
LAB_001a72b2:
        if (uVar12 != 0) {
          uVar26 = uVar26 | pWVar28->maskSelf;
        }
        pWVar28 = pLast;
        if ((uVar12 < nLoop) && (pWVar28 = pPath->aLoop[uVar12], (wctrlFlags >> 0xb & 1) != 0))
        goto LAB_001a7a10;
        if ((pWVar28->wsFlags & 0x400) == 0) {
          local_10c = (char)wctrlFlags;
          if (local_10c < '\0') {
            (pWVar28->u).btree.nDistinctCol = 0;
          }
          iCur = pWInfo->pTabList->a[pWVar28->iTab].iCursor;
          uVar31 = 0;
LAB_001a732f:
          if (((uVar30 >> (uVar31 & 0x3f) & 1) == 0) &&
             (pEVar23 = pEVar22[uVar31].pExpr, pEVar23 != (Expr *)0x0)) {
            do {
              if ((pEVar23->flags & 0x82000) == 0) {
                if ((((pEVar23->op == 0xa9) || (pEVar23->op == 0xa7)) && (pEVar23->iTable == iCur))
                   && (pWVar8 = sqlite3WhereFindTerm
                                          (&pWInfo->sWC,iCur,(int)pEVar23->iColumn,~uVar26,op,
                                           (Index *)0x0), pWVar8 != (WhereTerm *)0x0)) {
                  if (pWVar8->eOperator != 1) goto LAB_001a740e;
                  if ((ulong)pWVar28->nLTerm != 0) {
                    uVar27 = 0;
                    goto LAB_001a73fb;
                  }
                }
                break;
              }
              if ((pEVar23->flags >> 0x13 & 1) == 0) {
                pEVar19 = (ExprList_item *)&pEVar23->pLeft;
              }
              else {
                pEVar19 = ((pEVar23->x).pList)->a;
              }
              pEVar23 = pEVar19->pExpr;
            } while (pEVar23 != (Expr *)0x0);
          }
          goto LAB_001a7341;
        }
        uVar12 = uVar17;
        if ((pWVar28->u).vtab.isOrdered == '\0') {
          uVar12 = uVar30;
        }
        if ((wctrlFlags & 0x280) != 0x80) {
          uVar30 = uVar12;
        }
        bVar29 = false;
LAB_001a7a61:
        if ((uVar30 != uVar17) && (uVar13 = 0xff, bVar29)) {
          do {
            if ((long)uVar14 < 2) goto LAB_001a7223;
            uVar14 = uVar14 - 1;
            uVar13 = uVar14;
          } while ((-1L << ((byte)uVar14 & 0x3f) | uVar30) != 0xffffffffffffffff);
        }
      }
      goto LAB_001a7a69;
    }
  }
LAB_001a7223:
  uVar13 = 0;
LAB_001a7a69:
  return (i8)uVar13;
  while (uVar27 = uVar27 + 1, pWVar28->nLTerm != uVar27) {
LAB_001a73fb:
    if (pWVar8 == pWVar28->aLTerm[uVar27]) goto LAB_001a740e;
  }
  goto LAB_001a7341;
LAB_001a740e:
  if (((pWVar8->eOperator & 0x82) == 0) || (pEVar23->iColumn < 0)) {
LAB_001a74b1:
    uVar30 = uVar30 | 1L << ((byte)uVar31 & 0x3f);
  }
  else {
    pPVar4 = pWInfo->pParse;
    pCVar10 = sqlite3ExprCollSeq(pPVar4,pEVar22[uVar31].pExpr);
    if (pCVar10 == (CollSeq *)0x0) {
      pCVar10 = pPVar4->db->pDfltColl;
    }
    pEVar23 = pWVar8->pExpr;
    uVar25 = pEVar23->flags & 0x400;
    pCVar9 = sqlite3BinaryCompareCollSeq
                       (pPVar4,*(Expr **)((long)&pEVar23->pLeft + (ulong)(uVar25 >> 7)),
                        (&pEVar23->pLeft)[uVar25 == 0]);
    if (pCVar9 != (CollSeq *)0x0) {
      lVar16 = 0;
      do {
        bVar20 = pCVar10->zName[lVar16];
        if (bVar20 == pCVar9->zName[lVar16]) {
          if ((ulong)bVar20 == 0) goto LAB_001a74b1;
        }
        else if (""[bVar20] != ""[(byte)pCVar9->zName[lVar16]]) break;
        lVar16 = lVar16 + 1;
      } while( true );
    }
  }
LAB_001a7341:
  uVar31 = uVar31 + 1;
  if (uVar31 == uVar14) goto LAB_001a74ce;
  goto LAB_001a732f;
LAB_001a74ce:
  uVar25 = pWVar28->wsFlags;
  if ((uVar25 >> 0xc & 1) != 0) {
LAB_001a791c:
    local_b0 = local_b0 | pWVar28->maskSelf;
    uVar31 = 0;
    pEVar19 = pEVar22;
    do {
      uVar27 = 1L << ((byte)uVar31 & 0x3f);
      if ((uVar30 >> (uVar31 & 0x3f) & 1) == 0) {
        pEVar23 = pEVar19->pExpr;
        if (pEVar23 == (Expr *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = sqlite3WhereExprUsageNN(&pWInfo->sMaskSet,pEVar23);
          if (uVar11 == 0) {
            local_60.eCode = 1;
            local_60.xExprCallback = exprNodeIsConstant;
            local_60.xSelectCallback = sqlite3SelectWalkFail;
            local_60.u.n = 0;
            walkExpr(&local_60,pEVar23);
            if (local_60.eCode == 0) goto LAB_001a79ce;
            uVar11 = 0;
          }
        }
        if ((uVar11 & ~local_b0) != 0) {
          uVar27 = 0;
        }
        uVar30 = uVar30 | uVar27;
      }
LAB_001a79ce:
      uVar31 = uVar31 + 1;
      pEVar19 = pEVar19 + 1;
    } while (uVar14 != uVar31);
LAB_001a7a10:
    bVar29 = false;
    if ((uVar17 <= uVar30) ||
       (bVar32 = nLoop <= uVar12, uVar12 = uVar12 + 1, bVar29 = false, bVar32)) goto LAB_001a7a61;
    goto LAB_001a72b2;
  }
  if ((uVar25 >> 8 & 1) == 0) {
    pIVar18 = (pWVar28->u).btree.pIndex;
    if ((pIVar18 == (Index *)0x0) || ((pIVar18->field_0x63 & 4) != 0)) goto LAB_001a7223;
    uVar31 = (ulong)pIVar18->nColumn;
    bVar29 = -1 < (short)uVar25 && pIVar18->onError != '\0';
    if (uVar31 == 0) {
      bVar6 = false;
LAB_001a790a:
      if (!bVar6 && !bVar29) {
        bVar29 = true;
        goto LAB_001a7a61;
      }
      goto LAB_001a791c;
    }
    local_c0 = (uint)pIVar18->nKeyCol;
  }
  else {
    uVar31 = 1;
    local_c0 = 0;
    bVar29 = true;
    pIVar18 = (Index *)0x0;
  }
  uVar27 = 0;
  bVar32 = false;
  bVar20 = 0;
  bVar6 = false;
LAB_001a756e:
  uVar2 = (pWVar28->u).btree.nEq;
  bVar33 = true;
  bVar5 = true;
  if ((uVar2 <= uVar27) || (bVar5 = true, uVar27 < pWVar28->nSkip)) {
LAB_001a75ea:
    if (pIVar18 == (Index *)0x0) {
      uVar25 = 0xffffffff;
      bVar24 = 0;
    }
    else {
      bVar24 = pIVar18->aSortOrder[uVar27] & 1;
      sVar21 = pIVar18->aiColumn[uVar27];
      if (pIVar18->aiColumn[uVar27] == pIVar18->pTable->iPKey) {
        sVar21 = -1;
      }
      uVar25 = (uint)sVar21;
      if (bVar29) {
        if (sVar21 < 0) {
          bVar29 = sVar21 != -2;
        }
        else if (uVar27 < uVar2) {
          bVar29 = true;
        }
        else {
          bVar29 = (pIVar18->pTable->aCol[uVar25].field_0x8 & 0xf) != 0;
        }
      }
      else {
        bVar29 = false;
      }
    }
    if (bVar33) {
      uVar11 = 0;
      do {
        if (((uVar30 >> (uVar11 & 0x3f) & 1) == 0) &&
           (pEVar23 = pEVar22[uVar11].pExpr, pEVar23 != (Expr *)0x0)) {
          pA = pEVar23;
          do {
            if ((pA->flags & 0x82000) == 0) {
              if ((wctrlFlags & 0xc0) == 0) {
                bVar5 = false;
              }
              if ((int)uVar25 < -1) {
                iVar7 = sqlite3ExprCompareSkip(pA,pIVar18->aColExpr->a[uVar27].pExpr,iCur);
                if (iVar7 != 0) break;
                pEVar23 = pEVar22[uVar11].pExpr;
              }
              else {
                if ((((pA->op != 0xa9) && (pA->op != 0xa7)) || (pA->iTable != iCur)) ||
                   (uVar25 != (int)pA->iColumn)) break;
                if (uVar25 == 0xffffffff) goto LAB_001a77b9;
              }
              pPVar4 = pWInfo->pParse;
              pCVar10 = sqlite3ExprCollSeq(pPVar4,pEVar23);
              if (pCVar10 == (CollSeq *)0x0) {
                pCVar10 = pPVar4->db->pDfltColl;
              }
              lVar16 = 0;
              goto LAB_001a778f;
            }
            if ((pA->flags >> 0x13 & 1) == 0) {
              pEVar19 = (ExprList_item *)&pA->pLeft;
            }
            else {
              pEVar19 = ((pA->x).pList)->a;
            }
            pA = pEVar19->pExpr;
          } while (pA != (Expr *)0x0);
        }
LAB_001a7684:
      } while ((bVar5) && (uVar11 = uVar11 + 1, uVar11 < uVar14));
    }
    goto LAB_001a78e8;
  }
  pWVar8 = pWVar28->aLTerm[uVar27];
  uVar3 = pWVar8->eOperator;
  if ((op & uVar3) == 0) {
    if ((uVar3 & 1) == 0) {
LAB_001a75bf:
      bVar5 = true;
    }
    else {
      uVar11 = uVar27;
      do {
        bVar33 = uVar2 - 1 == uVar11;
        if (bVar33) goto LAB_001a75bf;
        lVar16 = uVar11 + 1;
        uVar11 = uVar11 + 1;
        bVar5 = false;
      } while (pWVar28->aLTerm[lVar16]->pExpr != pWVar8->pExpr);
    }
    goto LAB_001a75ea;
  }
  if ((uVar3 & 0x180) != 0) {
    bVar29 = false;
  }
  goto LAB_001a7870;
LAB_001a778f:
  bVar15 = pCVar10->zName[lVar16];
  if (bVar15 == pIVar18->azColl[uVar27][lVar16]) {
    if ((ulong)bVar15 == 0) goto LAB_001a77b9;
  }
  else if (""[bVar15] != ""[(byte)pIVar18->azColl[uVar27][lVar16]]) goto LAB_001a7684;
  lVar16 = lVar16 + 1;
  goto LAB_001a778f;
LAB_001a77b9:
  if (local_10c < '\0') {
    (pWVar28->u).btree.nDistinctCol = (short)uVar27 + 1;
  }
  if ((wctrlFlags & 0x40) == 0) {
    if (bVar32) {
      bVar15 = pOrderBy->a[uVar11 & 0xffffffff].fg.sortFlags;
      bVar32 = true;
      if ((bVar24 ^ bVar20) != (bVar15 & 1)) goto LAB_001a78e8;
    }
    else {
      bVar15 = pOrderBy->a[uVar11 & 0xffffffff].fg.sortFlags;
      bVar20 = bVar15 & 1 ^ bVar24;
      bVar32 = true;
      if ((bVar15 & 1) != bVar24) {
        *pRevMask = *pRevMask | 1L << ((byte)uVar12 & 0x3f);
      }
    }
  }
  else {
    bVar15 = pOrderBy->a[uVar11 & 0xffffffff].fg.sortFlags;
  }
  if ((bVar15 & 2) != 0) {
    if (uVar27 != (pWVar28->u).btree.nEq) {
LAB_001a78e8:
      if ((uint)uVar27 < local_c0) {
        bVar29 = false;
      }
      if (uVar27 == 0) {
        bVar29 = false;
      }
      goto LAB_001a790a;
    }
    pbVar1 = (byte *)((long)&pWVar28->wsFlags + 2);
    *pbVar1 = *pbVar1 | 8;
  }
  if (uVar25 == 0xffffffff) {
    bVar6 = true;
  }
  uVar30 = uVar30 | 1L << (uVar11 & 0x3f);
LAB_001a7870:
  uVar27 = uVar27 + 1;
  if (uVar27 == uVar31) goto LAB_001a790a;
  goto LAB_001a756e;
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & (WHERE_ORDERBY_LIMIT|WHERE_ORDERBY_MAX|WHERE_ORDERBY_MIN) ){
    eqOpMask |= WO_IN;
  }
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered
       && ((wctrlFlags&(WHERE_DISTINCTBY|WHERE_SORTBYGROUP))!=WHERE_DISTINCTBY)
      ){
        obSat = obDone;
      }
      break;
    }else if( wctrlFlags & WHERE_DISTINCTBY ){
      pLoop->u.btree.nDistinctCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollateAndLikely(pOrderBy->a[i].pExpr);
      if( NEVER(pOBExpr==0) ) continue;
      if( pOBExpr->op!=TK_COLUMN && pOBExpr->op!=TK_AGG_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags &
               (WHERE_ORDERBY_LIMIT|WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX) );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        Parse *pParse = pWInfo->pParse;
        CollSeq *pColl1 = sqlite3ExprNNCollSeq(pParse, pOrderBy->a[i].pExpr);
        CollSeq *pColl2 = sqlite3ExprCompareCollSeq(pParse, pTerm->pExpr);
        assert( pColl1 );
        if( pColl2==0 || sqlite3StrICmp(pColl1->zName, pColl2->zName) ){
          continue;
        }
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        /* All relevant terms of the index must also be non-NULL in order
        ** for isOrderDistinct to be true.  So the isOrderDistint value
        ** computed here might be a false positive.  Corrections will be
        ** made at tag-20210426-1 below */
        isOrderDistinct = IsUniqueIndex(pIndex)
                          && (pLoop->wsFlags & WHERE_SKIPSCAN)==0;
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing).  Except, IS and ISNULL
          ** terms imply that the index is not UNIQUE NOT NULL in which case
          ** the loop need to be marked as not order-distinct because it can
          ** have repeated NULL rows.
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...))
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.
          */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & (WO_ISNULL|WO_IS) ){
              testcase( eOp & WO_ISNULL );
              testcase( eOp & WO_IS );
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j] & KEYINFO_ORDER_DESC;
          if( iColumn==pIndex->pTable->iPKey ) iColumn = XN_ROWID;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered.  tag-20210426-1
        */
        if( isOrderDistinct ){
          if( iColumn>=0
           && j>=pLoop->u.btree.nEq
           && pIndex->pTable->aCol[iColumn].notNull==0
          ){
            isOrderDistinct = 0;
          }
          if( iColumn==XN_EXPR ){
            isOrderDistinct = 0;
          }
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollateAndLikely(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( NEVER(pOBExpr==0) ) continue;
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=XN_ROWID ){
            if( pOBExpr->op!=TK_COLUMN && pOBExpr->op!=TK_AGG_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            Expr *pIdxExpr = pIndex->aColExpr->a[j].pExpr;
            if( sqlite3ExprCompareSkip(pOBExpr, pIdxExpr, iCur) ){
              continue;
            }
          }
          if( iColumn!=XN_ROWID ){
            pColl = sqlite3ExprNNCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          if( wctrlFlags & WHERE_DISTINCTBY ){
            pLoop->u.btree.nDistinctCol = j+1;
          }
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)
                           != (pOrderBy->a[i].fg.sortFlags&KEYINFO_ORDER_DESC)
            ){
              isMatch = 0;
            }
          }else{
            rev = revIdx ^ (pOrderBy->a[i].fg.sortFlags & KEYINFO_ORDER_DESC);
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch && (pOrderBy->a[i].fg.sortFlags & KEYINFO_ORDER_BIGNULL) ){
          if( j==pLoop->u.btree.nEq ){
            pLoop->wsFlags |= WHERE_BIGNULL_SORT;
          }else{
            isMatch = 0;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = ALWAYS(i<BMS) ? MASKBIT(i) - 1 : 0;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}